

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O1

CompressionFunction * duckdb::DictionaryCompressionFun::GetFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_DICTIONARY;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = DictionaryCompressionStorage::StringInitAnalyze;
  in_RDI->analyze = DictionaryCompressionStorage::StringAnalyze;
  in_RDI->final_analyze = DictionaryCompressionStorage::StringFinalAnalyze;
  in_RDI->init_compression = DictionaryCompressionStorage::InitCompression;
  in_RDI->compress = DictionaryCompressionStorage::Compress;
  in_RDI->compress_finalize = DictionaryCompressionStorage::FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = DictionaryCompressionStorage::StringInitScan;
  in_RDI->scan_vector = DictionaryCompressionStorage::StringScan;
  in_RDI->scan_partial = DictionaryCompressionStorage::StringScanPartial<false>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = DictionaryCompressionStorage::StringFetchRow;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = UncompressedStringStorage::StringInitSegment;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

CompressionFunction DictionaryCompressionFun::GetFunction(PhysicalType data_type) {
	return CompressionFunction(
	    CompressionType::COMPRESSION_DICTIONARY, data_type, DictionaryCompressionStorage ::StringInitAnalyze,
	    DictionaryCompressionStorage::StringAnalyze, DictionaryCompressionStorage::StringFinalAnalyze,
	    DictionaryCompressionStorage::InitCompression, DictionaryCompressionStorage::Compress,
	    DictionaryCompressionStorage::FinalizeCompress, DictionaryCompressionStorage::StringInitScan,
	    DictionaryCompressionStorage::StringScan, DictionaryCompressionStorage::StringScanPartial<false>,
	    DictionaryCompressionStorage::StringFetchRow, UncompressedFunctions::EmptySkip,
	    UncompressedStringStorage::StringInitSegment);
}